

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticEmitterSystemData.cpp
# Opt level: O0

int __thiscall DIS::AcousticEmitterSystemData::getMarshalledSize(AcousticEmitterSystemData *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  undefined1 local_50 [8];
  AcousticBeamData listElement;
  unsigned_long_long idx;
  int marshalSize;
  AcousticEmitterSystemData *this_local;
  
  iVar2 = AcousticEmitterSystem::getMarshalledSize(&this->_acousticEmitterSystem);
  iVar3 = Vector3Float::getMarshalledSize(&this->_emitterLocation);
  idx._4_4_ = iVar2 + 4 + iVar3;
  listElement._fundamentalDataParameters._deBeamwidth = 0.0;
  listElement._fundamentalDataParameters._28_4_ = 0;
  while( true ) {
    uVar1 = listElement._fundamentalDataParameters._24_8_;
    sVar4 = std::vector<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>::size
                      (&this->_beamRecords);
    if (sVar4 <= (ulong)uVar1) break;
    pvVar5 = std::vector<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>::operator[]
                       (&this->_beamRecords,listElement._fundamentalDataParameters._24_8_);
    AcousticBeamData::AcousticBeamData((AcousticBeamData *)local_50,pvVar5);
    iVar2 = AcousticBeamData::getMarshalledSize((AcousticBeamData *)local_50);
    idx._4_4_ = idx._4_4_ + iVar2;
    AcousticBeamData::~AcousticBeamData((AcousticBeamData *)local_50);
    listElement._fundamentalDataParameters._24_8_ =
         listElement._fundamentalDataParameters._24_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int AcousticEmitterSystemData::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 1;  // _emitterSystemDataLength
   marshalSize = marshalSize + 1;  // _numberOfBeams
   marshalSize = marshalSize + 2;  // _pad2
   marshalSize = marshalSize + _acousticEmitterSystem.getMarshalledSize();  // _acousticEmitterSystem
   marshalSize = marshalSize + _emitterLocation.getMarshalledSize();  // _emitterLocation

   for(unsigned long long idx=0; idx < _beamRecords.size(); idx++)
   {
        AcousticBeamData listElement = _beamRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}